

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewrite.h
# Opt level: O1

FastPattern *
trieste::detail::FastPattern::match_opt(FastPattern *__return_storage_ptr__,FastPattern *pattern)

{
  _Rb_tree<trieste::Token,_trieste::Token,_std::_Identity<trieste::Token>,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
  local_78;
  _Rb_tree<trieste::Token,_trieste::Token,_std::_Identity<trieste::Token>,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
  local_48;
  
  if (((pattern->starts)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) &&
     ((pattern->pass_through & 1U) == 0)) {
    CLI::std::
    _Rb_tree<trieste::Token,_trieste::Token,_std::_Identity<trieste::Token>,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
    ::_Rb_tree((_Rb_tree<trieste::Token,_trieste::Token,_std::_Identity<trieste::Token>,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
                *)__return_storage_ptr__,
               (_Rb_tree<trieste::Token,_trieste::Token,_std::_Identity<trieste::Token>,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
                *)pattern);
    CLI::std::
    _Rb_tree<trieste::Token,_trieste::Token,_std::_Identity<trieste::Token>,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
    ::_Rb_tree(&(__return_storage_ptr__->parents)._M_t,&(pattern->parents)._M_t);
    __return_storage_ptr__->pass_through = pattern->pass_through;
  }
  else {
    CLI::std::
    _Rb_tree<trieste::Token,_trieste::Token,_std::_Identity<trieste::Token>,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
    ::_Rb_tree(&local_48,
               (_Rb_tree<trieste::Token,_trieste::Token,_std::_Identity<trieste::Token>,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
                *)pattern);
    local_78._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_78._M_impl.super__Rb_tree_header._M_header;
    local_78._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_78._M_impl._0_8_ = 0;
    local_78._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_78._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_78._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_78._M_impl.super__Rb_tree_header._M_header._M_right =
         local_78._M_impl.super__Rb_tree_header._M_header._M_left;
    FastPattern(__return_storage_ptr__,
                (set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_> *)
                &local_48,
                (set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_> *)
                &local_78,true);
    CLI::std::
    _Rb_tree<trieste::Token,_trieste::Token,_std::_Identity<trieste::Token>,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
    ::~_Rb_tree(&local_78);
    CLI::std::
    _Rb_tree<trieste::Token,_trieste::Token,_std::_Identity<trieste::Token>,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
    ::~_Rb_tree(&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

static FastPattern match_opt(const FastPattern& pattern)
      {
        if (pattern.any_first())
          return pattern;

        return FastPattern(pattern.starts, {}, true);
      }